

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

string * testing::internal::AppendUserMessage
                   (string *__return_storage_ptr__,string *gtest_msg,Message *user_msg)

{
  pointer pcVar1;
  long lVar2;
  long *plVar3;
  size_type *psVar4;
  undefined1 local_60 [8];
  string user_msg_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  
  StringStreamToString((string *)local_60,(user_msg->ss_).ptr_);
  if (user_msg_string._M_dataplus._M_p == (pointer)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (gtest_msg->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + gtest_msg->_M_string_length);
  }
  else {
    pcVar1 = (gtest_msg->_M_dataplus)._M_p;
    user_msg_string.field_2._8_8_ = &__str._M_string_length;
    std::__cxx11::string::_M_construct<char*>
              ((string *)((long)&user_msg_string.field_2 + 8),pcVar1,
               pcVar1 + gtest_msg->_M_string_length);
    std::__cxx11::string::append(user_msg_string.field_2._M_local_buf + 8);
    plVar3 = (long *)std::__cxx11::string::_M_append
                               (user_msg_string.field_2._M_local_buf + 8,(ulong)local_60);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar4 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar4) {
      lVar2 = plVar3[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    }
    __return_storage_ptr__->_M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if ((size_type *)user_msg_string.field_2._8_8_ != &__str._M_string_length) {
      operator_delete((void *)user_msg_string.field_2._8_8_);
    }
  }
  if (local_60 != (undefined1  [8])&user_msg_string._M_string_length) {
    operator_delete((void *)local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AppendUserMessage(const std::string& gtest_msg,
                              const Message& user_msg) {
  // Appends the user message if it's non-empty.
  const std::string user_msg_string = user_msg.GetString();
  if (user_msg_string.empty()) {
    return gtest_msg;
  }

  return gtest_msg + "\n" + user_msg_string;
}